

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteInstruction.cpp
# Opt level: O2

int do_inc(void)

{
  byte bVar1;
  byte bVar2;
  undefined4 *puVar3;
  char pram;
  short pram_00;
  uint pram_01;
  
  bVar1 = code_ptr[registe_ptr->IP + 1];
  bVar2 = bVar1 >> 4;
  if ((bVar1 & 0xf) == 2) {
    pram_01 = *register_list[bVar2] + 1;
    *register_list[bVar2] = pram_01;
    set_flag(pram_01);
  }
  else if ((bVar1 & 0xf) == 1) {
    pram_00 = (short)*register_list[bVar2] + 1;
    *(short *)register_list[bVar2] = pram_00;
    set_flag(pram_00);
  }
  else {
    if ((bVar1 & 0xf) != 0) {
      puVar3 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar3 = 0xf6;
      __cxa_throw(puVar3,&int::typeinfo,0);
    }
    pram = (char)*register_list[bVar2] + '\x01';
    *(char *)register_list[bVar2] = pram;
    set_flag(pram);
  }
  return 1;
}

Assistant:

int do_inc(){
	uint8_t high = (uint8_t)code_ptr[registe_ptr->IP + 1] / 0x10;
	uint8_t low = (uint8_t)code_ptr[registe_ptr->IP + 1] % 0x10;
	switch (low)
	{
	case 0: {
		char*Ra = (char *)register_list[high];
		++*Ra;
		set_flag(*Ra);
		break;
	}
	case 1: {
		int16_t *Ra = (int16_t *)register_list[high];
		++*Ra;
		set_flag(*Ra);
		break;
	}
	case 2: {
		unsigned *Ra = (unsigned *)register_list[high];
		++*Ra;
		set_flag(*Ra);
		break;
	}
	default:
	{
		throw(LVM_EXECUTE_ERROR);
		break;
	}
	}
	return LVM_SUCCESS;
}